

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

GCPtr<symbols::Object> __thiscall evaluator::Evaluator::Eval(Evaluator *this,Node *node,Env *env)

{
  pointer *this_00;
  bool bVar1;
  int iVar2;
  ReturnObject *this_01;
  Object *pOVar3;
  RangeObject *this_02;
  size_type sVar4;
  reference pvVar5;
  FunctionObject *this_03;
  StringObject *this_04;
  IntObject *this_05;
  Token *op;
  long local_318;
  Object *local_2f0;
  Assign *local_2e0;
  long local_2d0;
  long local_2b8;
  long local_2a0;
  StringLiteral *local_290;
  long local_278;
  FunctionLiteral *local_268;
  long local_240;
  long local_230;
  long local_218;
  FunctionStmt *local_208;
  DeclareStmt *local_1f8;
  InitStmt *local_1e8;
  Object *local_1b0;
  IfStmt *local_1a0;
  ForRangeStmt *local_190;
  BlockStmt *local_180;
  GCPtr<symbols::Object> local_160;
  GCPtr<symbols::Object> value_1;
  GCPtr<symbols::Object> RightValue_1;
  GCPtr<symbols::Object> LeftValue;
  BinaryOp *Op_1;
  GCPtr<symbols::Object> local_138;
  GCPtr<symbols::Object> RightValue;
  UniaryOp *Op;
  Assign *expr_3;
  BooleanExpr *expr_2;
  Number *num;
  string local_108;
  long local_e8;
  StringLiteral *literal;
  Identifier *ident;
  vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> local_d0;
  long local_b8;
  FunctionLiteral *func;
  BuiltinFunction *builtin_func;
  vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> args;
  GCPtr<symbols::Object> function;
  CallExpression *expr_1;
  ExpressionStmt *stmt_5;
  RangeExpr *expr;
  FunctionStmt *stmt_4;
  DeclareStmt *stmt_3;
  InitStmt *stmt_2;
  GCPtr<symbols::Object> local_48;
  GCPtr<symbols::Object> value;
  ReturnStmt *stmt_1;
  IfStmt *stmt;
  ForRangeStmt *for_stmt;
  BlockStmt *block;
  Env *env_local;
  Node *node_local;
  
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 == 3) {
    if (node == (Node *)0x0) {
      local_180 = (BlockStmt *)0x0;
    }
    else {
      local_180 = (BlockStmt *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::BlockStmt::typeinfo,0)
      ;
    }
    evalBlockStatement(this,local_180,env);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 == 0x15) {
    if (node == (Node *)0x0) {
      local_190 = (ForRangeStmt *)0x0;
    }
    else {
      local_190 = (ForRangeStmt *)
                  __dynamic_cast(node,&ast::Node::typeinfo,&ast::ForRangeStmt::typeinfo,0);
    }
    evalForRangeStatement(this,local_190,env);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 == 0xd) {
    if (node == (Node *)0x0) {
      local_1a0 = (IfStmt *)0x0;
    }
    else {
      local_1a0 = (IfStmt *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::IfStmt::typeinfo,0);
    }
    evalIfStatement(this,local_1a0,env);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 == 10) {
    if (node == (Node *)0x0) {
      local_1b0 = (Object *)0x0;
    }
    else {
      local_1b0 = (Object *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::ReturnStmt::typeinfo,0);
    }
    value.addr = local_1b0;
    Eval((Evaluator *)&local_48,(Node *)local_1b0[4]._vptr_Object,env);
    bVar1 = isError(&local_48);
    if (bVar1) {
      pOVar3 = GCPtr<symbols::Object>::raw(&local_48);
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar3);
    }
    else {
      this_01 = (ReturnObject *)operator_new(0x18);
      pOVar3 = GCPtr<symbols::Object>::unref(&local_48);
      symbols::ReturnObject::ReturnObject(this_01,pOVar3);
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_01);
    }
    GCPtr<symbols::Object>::~GCPtr(&local_48);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 == 0x11) {
    if (node == (Node *)0x0) {
      local_1e8 = (InitStmt *)0x0;
    }
    else {
      local_1e8 = (InitStmt *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::InitStmt::typeinfo,0);
    }
    evalInitStatement(this,local_1e8,env);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 == 0x14) {
    if (node == (Node *)0x0) {
      local_1f8 = (DeclareStmt *)0x0;
    }
    else {
      local_1f8 = (DeclareStmt *)
                  __dynamic_cast(node,&ast::Node::typeinfo,&ast::DeclareStmt::typeinfo,0);
    }
    evalDeclareStatement(this,local_1f8,env);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 == 0xf) {
    if (node == (Node *)0x0) {
      local_208 = (FunctionStmt *)0x0;
    }
    else {
      local_208 = (FunctionStmt *)
                  __dynamic_cast(node,&ast::Node::typeinfo,&ast::FunctionStmt::typeinfo,0);
    }
    evalFunctionStmt(this,local_208,env);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 == 0x12) {
    if (node == (Node *)0x0) {
      local_218 = 0;
    }
    else {
      local_218 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::RangeExpr::typeinfo,0);
    }
    this_02 = (RangeObject *)operator_new(0x18);
    symbols::RangeObject::RangeObject(this_02,*(int *)(local_218 + 0x40),*(int *)(local_218 + 0x44))
    ;
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_02);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 == 8) {
    if (node == (Node *)0x0) {
      local_230 = 0;
    }
    else {
      local_230 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::ExpressionStmt::typeinfo,0);
    }
    Eval(this,*(Node **)(local_230 + 0x40),env);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  iVar2 = (*node->_vptr_Node[2])();
  if (iVar2 != 0x13) {
    iVar2 = (*node->_vptr_Node[2])();
    if (iVar2 == 0x10) {
      if (node == (Node *)0x0) {
        local_278 = 0;
      }
      else {
        local_278 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::FunctionLiteral::typeinfo,0);
      }
      local_b8 = local_278;
      this_03 = (FunctionObject *)operator_new(0x38);
      ident._7_1_ = 1;
      std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::vector
                (&local_d0,
                 (vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> *)(local_b8 + 0x48))
      ;
      symbols::FunctionObject::FunctionObject
                (this_03,&local_d0,*(BlockStmt **)(local_b8 + 0x60),env);
      ident._7_1_ = 0;
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_03);
      std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::~vector(&local_d0);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])();
    if (iVar2 == 0xc) {
      if (node == (Node *)0x0) {
        local_290 = (StringLiteral *)0x0;
      }
      else {
        local_290 = (StringLiteral *)
                    __dynamic_cast(node,&ast::Node::typeinfo,&ast::Identifier::typeinfo,0);
      }
      literal = local_290;
      pOVar3 = evalIdentifier((Identifier *)local_290,env);
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar3);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])();
    if (iVar2 == 0xb) {
      if (node == (Node *)0x0) {
        local_2a0 = 0;
      }
      else {
        local_2a0 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::StringLiteral::typeinfo,0);
      }
      local_e8 = local_2a0;
      this_04 = (StringObject *)operator_new(0x38);
      std::__cxx11::string::string
                ((string *)&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_e8 + 0x40));
      symbols::StringObject::StringObject(this_04,&local_108);
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_04);
      std::__cxx11::string::~string((string *)&local_108);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])();
    if (iVar2 == 5) {
      if (node == (Node *)0x0) {
        local_2b8 = 0;
      }
      else {
        local_2b8 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::Number::typeinfo,0);
      }
      this_05 = (IntObject *)operator_new(0x18);
      symbols::IntObject::IntObject(this_05,*(int *)(local_2b8 + 0x40));
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)this_05);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])();
    if (iVar2 == 4) {
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_NULL);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])();
    if (iVar2 == 1) {
      if (node == (Node *)0x0) {
        local_2d0 = 0;
      }
      else {
        local_2d0 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::BooleanExpr::typeinfo,0);
      }
      nativeBooleanObject(this,(bool)(*(byte *)(local_2d0 + 0x40) & 1));
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])();
    if (iVar2 == 0x16) {
      if (node == (Node *)0x0) {
        local_2e0 = (Assign *)0x0;
      }
      else {
        local_2e0 = (Assign *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::Assign::typeinfo,0);
      }
      evalAssignExpression(this,local_2e0,env);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])();
    if (iVar2 == 7) {
      if (node == (Node *)0x0) {
        local_2f0 = (Object *)0x0;
      }
      else {
        local_2f0 = (Object *)__dynamic_cast(node,&ast::Node::typeinfo,&ast::UniaryOp::typeinfo,0);
      }
      RightValue.addr = local_2f0;
      Eval((Evaluator *)&local_138,*(Node **)&local_2f0[4]._type,env);
      bVar1 = isError(&local_138);
      if (bVar1) {
        GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&local_138);
      }
      else {
        op = (Token *)(RightValue.addr + 1);
        GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)&Op_1,&local_138);
        evalUniaryExpression(this,op,(GCPtr<symbols::Object> *)&Op_1);
        GCPtr<symbols::Object>::~GCPtr((GCPtr<symbols::Object> *)&Op_1);
      }
      GCPtr<symbols::Object>::~GCPtr(&local_138);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    iVar2 = (*node->_vptr_Node[2])();
    if (iVar2 == 6) {
      if (node == (Node *)0x0) {
        local_318 = 0;
      }
      else {
        local_318 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::BinaryOp::typeinfo,0);
      }
      Eval((Evaluator *)&RightValue_1,*(Node **)(local_318 + 0x50),env);
      bVar1 = isError(&RightValue_1);
      if (bVar1) {
        pOVar3 = GCPtr<symbols::Object>::unref(&RightValue_1);
        GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar3);
      }
      else {
        Eval((Evaluator *)&value_1,*(Node **)(local_318 + 0x48),env);
        bVar1 = isError(&value_1);
        if (bVar1) {
          pOVar3 = GCPtr<symbols::Object>::unref(&value_1);
          GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar3);
        }
        else {
          evalBinaryExpression
                    ((Evaluator *)&local_160,(Token *)(local_318 + 0x10),&RightValue_1,&value_1);
          GCPtr<symbols::Object>::unref(&RightValue_1);
          GCPtr<symbols::Object>::unref(&value_1);
          pOVar3 = GCPtr<symbols::Object>::raw(&local_160);
          GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pOVar3);
          GCPtr<symbols::Object>::~GCPtr(&local_160);
        }
        GCPtr<symbols::Object>::~GCPtr(&value_1);
      }
      GCPtr<symbols::Object>::~GCPtr(&RightValue_1);
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,(Object *)0x0);
    return (GCPtr<symbols::Object>)(Object *)this;
  }
  if (node == (Node *)0x0) {
    local_240 = 0;
  }
  else {
    local_240 = __dynamic_cast(node,&ast::Node::typeinfo,&ast::CallExpression::typeinfo,0);
  }
  this_00 = &args.
             super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  Eval((Evaluator *)this_00,*(Node **)(local_240 + 0x40),env);
  bVar1 = isError((GCPtr<symbols::Object> *)this_00);
  if (bVar1) {
    GCPtr<symbols::Object>::GCPtr
              ((GCPtr<symbols::Object> *)this,
               (GCPtr<symbols::Object> *)
               &args.
                super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    goto LAB_00111fdd;
  }
  evalExpressions((vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                  &builtin_func,
                  (vector<ast::Expr_*,_std::allocator<ast::Expr_*>_> *)(local_240 + 0x48),env);
  sVar4 = std::vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::size
                    ((vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                     &builtin_func);
  if (sVar4 == 1) {
    pvVar5 = std::vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::
             operator[]((vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                        &builtin_func,0);
    bVar1 = isError(pvVar5);
    if (!bVar1) goto LAB_00111f0f;
    pvVar5 = std::vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::
             operator[]((vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                        &builtin_func,0);
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,pvVar5);
  }
  else {
LAB_00111f0f:
    pOVar3 = GCPtr<symbols::Object>::raw
                       ((GCPtr<symbols::Object> *)
                        &args.
                         super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pOVar3 == (Object *)0x0) {
      local_268 = (FunctionLiteral *)0x0;
    }
    else {
      local_268 = (FunctionLiteral *)
                  __dynamic_cast(pOVar3,&symbols::Object::typeinfo,
                                 &symbols::BuiltinFunction::typeinfo,0);
    }
    func = local_268;
    if (local_268 == (FunctionLiteral *)0x0) {
      applyFunction(this,(GCPtr<symbols::Object> *)
                         &args.
                          super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                    &builtin_func);
    }
    else {
      GCPtr<symbols::Object>::unref
                ((GCPtr<symbols::Object> *)
                 &args.
                  super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      applyBuiltinFunction
                (this,(BuiltinFunction *)func,
                 (vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                 &builtin_func);
    }
  }
  std::vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::~vector
            ((vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
             &builtin_func);
LAB_00111fdd:
  GCPtr<symbols::Object>::~GCPtr
            ((GCPtr<symbols::Object> *)
             &args.
              super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::Eval(Node* node, Env* env)
{
    if (node->type() == NodeType::BlockStmtType){
        auto block = dynamic_cast<BlockStmt*>(node);
        return evalBlockStatement(block, env);
    }
    else if (node->type() == NodeType::ForStmtType){
        auto* for_stmt = dynamic_cast<ForRangeStmt*>(node);
        return evalForRangeStatement(for_stmt, env);
    }
   else if(node->type() == NodeType::IfStmtType){
       auto stmt = dynamic_cast<IfStmt*>(node);
       return evalIfStatement(stmt, env);
   }
   else if(node->type() == NodeType::ReturnStmtType){
       auto stmt = dynamic_cast<ReturnStmt*>(node);
       auto value = Eval(stmt->returnValue, env);
       if(isError(value)){
           return value.raw();
       }
       return new ReturnObject(value.unref());
   }
   else if(node->type() == NodeType::InitStmtType){
       auto stmt = dynamic_cast<InitStmt*>(node);
       return evalInitStatement(stmt, env);
   }
   else if(node->type() == NodeType::DeclareStmtType){
       auto stmt = dynamic_cast<DeclareStmt*>(node);
       return evalDeclareStatement(stmt, env);
   }
   else if(node->type() == NodeType::FunctionStmtType){
       auto stmt = dynamic_cast<FunctionStmt*>(node);
       return evalFunctionStmt(stmt, env);
   }
   else if(node->type() == NodeType::RangeExprType){
        auto* expr = dynamic_cast<RangeExpr*>(node);
        return new RangeObject(expr->init_value, expr->end_value);
   }
   else if(node->type() == NodeType::ExpressionStmtType){
       auto stmt = dynamic_cast<ExpressionStmt*>(node);
       return Eval(stmt->Expression, env);
   }
   else if(node->type() == NodeType::CallExprType){
       auto expr = dynamic_cast<CallExpression*>(node);
       auto function = Eval(expr->function, env);
       if(isError(function)){
           return function;
       }
       auto args = evalExpressions(expr->arguments, env);
       if(args.size() == 1 && isError(args[0])){
            return args[0];
       }
       if(auto builtin_func = dynamic_cast<BuiltinFunction*>(function.raw())){
            function.unref();
            return applyBuiltinFunction(builtin_func, args);
       }
       return applyFunction(function, args);
   }
   else if(node->type() == NodeType::FunctionExprType){
       auto func = dynamic_cast<FunctionLiteral*>(node);
       return new FunctionObject(func->parameters, func->body, env);
   }
   else if(node->type() == NodeType::IdentifierType){
       auto ident = dynamic_cast<Identifier*>(node);
       return evalIdentifier(ident, env);
   }
   else if(node->type() == NodeType::StringLiteralType){
       auto literal = dynamic_cast<StringLiteral*>(node);
       return new StringObject(literal->Literal);
   }
   else if(node->type() == NodeType::NumberType){
       auto num = dynamic_cast<Number*>(node);
       return new IntObject(num->value);
   }
   else if(node->type() == NodeType::NullType){
       return NATIVE_NULL;
   }
   else if(node->type() == NodeType::BooleanType){
       auto expr = dynamic_cast<BooleanExpr*>(node);
       return nativeBooleanObject(expr->value);
   }
   else if(node->type() == NodeType::AssignStmtType){
        auto* expr = dynamic_cast<Assign*>(node);
        return evalAssignExpression(expr, env);
   }
   else if(node->type() == NodeType::UniaryOpType){
       auto Op = dynamic_cast<UniaryOp*>(node);
       auto RightValue = Eval(Op->RightOp, env);
       if(isError(RightValue)){
           return RightValue;
       }
       return evalUniaryExpression(Op->tok, RightValue);
   }else if(node->type() == NodeType::BinaryOpType){
       auto Op = dynamic_cast<BinaryOp*>(node);
       auto LeftValue = Eval(Op->LeftOp, env);
       if(isError(LeftValue)){
           return LeftValue.unref();
       }
       auto RightValue = Eval(Op->RightOp, env);
       if(isError(RightValue)){
           return RightValue.unref();
       }
       auto value = evalBinaryExpression(Op->tok, LeftValue, RightValue);
       LeftValue.unref();
       RightValue.unref();
       return value.raw();
   }
   return nullptr;
}